

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

ExpressionSpec *
rsg::anon_unknown_0::chooseExpression
          (GeneratorState *state,ExpressionSpec *specs,int numSpecs,ConstValueRangeAccess valueRange
          )

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  ExpressionSpec *pEVar4;
  undefined4 uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float weights [30];
  float afStack_a8 [30];
  
  lVar2 = 0;
  uVar3 = 0;
  if (0 < numSpecs) {
    uVar3 = (ulong)(uint)numSpecs;
  }
  for (; uVar3 * 4 != lVar2; lVar2 = lVar2 + 4) {
    uVar5 = (**(code **)((long)&specs->getWeight + lVar2 * 4))(state);
    *(undefined4 *)((long)afStack_a8 + lVar2) = uVar5;
  }
  fVar6 = 0.0;
  for (iVar1 = 0; numSpecs != iVar1; iVar1 = iVar1 + 1) {
    fVar6 = fVar6 + afStack_a8[iVar1];
  }
  pEVar4 = specs + (uint)numSpecs;
  fVar7 = deRandom_getFloat(&state->m_random->m_rnd);
  iVar1 = 0;
  fVar8 = 0.0;
  while( true ) {
    lVar2 = (long)iVar1;
    if (lVar2 * 0x10 == (ulong)(uint)numSpecs * 0x10) {
      return pEVar4;
    }
    fVar8 = fVar8 + afStack_a8[lVar2];
    if (fVar6 * fVar7 + 0.0 < fVar8) break;
    if (0.0 < afStack_a8[lVar2]) {
      pEVar4 = specs + lVar2;
    }
    iVar1 = iVar1 + 1;
  }
  return specs + lVar2;
}

Assistant:

const ExpressionSpec* chooseExpression (GeneratorState& state, const ExpressionSpec* specs, int numSpecs, ConstValueRangeAccess valueRange)
{
	float weights[MAX_EXPRESSION_SPECS];

	DE_ASSERT(numSpecs <= (int)DE_LENGTH_OF_ARRAY(weights));

	// Compute weights
	for (int ndx = 0; ndx < numSpecs; ndx++)
		weights[ndx] = specs[ndx].getWeight(state, valueRange);

	// Choose
	return &state.getRandom().chooseWeighted<const ExpressionSpec&>(specs, specs+numSpecs, weights);
}